

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_CloseStream(PaStream *stream)

{
  undefined8 *puVar1;
  PaStream *in_RDI;
  PaError result;
  PaUtilStreamInterface *interface;
  int local_14;
  
  local_14 = PaUtil_ValidateStreamPointer(in_RDI);
  RemoveOpenStream(in_RDI);
  if (local_14 == 0) {
    puVar1 = *(undefined8 **)((long)in_RDI + 0x10);
    local_14 = (*(code *)puVar1[4])(in_RDI);
    if (local_14 == 1) {
      local_14 = 0;
    }
    else if (local_14 == 0) {
      local_14 = (*(code *)puVar1[3])(in_RDI);
    }
    if (local_14 == 0) {
      local_14 = (*(code *)*puVar1)(in_RDI);
    }
  }
  return local_14;
}

Assistant:

PaError Pa_CloseStream( PaStream* stream )
{
    PaUtilStreamInterface *interface;
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_CloseStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    /* always remove the open stream from our list, even if this function
        eventually returns an error. Otherwise CloseOpenStreams() will
        get stuck in an infinite loop */
    RemoveOpenStream( stream ); /* be sure to call this _before_ closing the stream */

    if( result == paNoError )
    {
        interface = PA_STREAM_INTERFACE(stream);

        /* abort the stream if it isn't stopped */
        result = interface->IsStopped( stream );
        if( result == 1 )
            result = paNoError;
        else if( result == 0 )
            result = interface->Abort( stream );

        if( result == paNoError )                 /** @todo REVIEW: shouldn't we close anyway? see: http://www.portaudio.com/trac/ticket/115 */
            result = interface->Close( stream );
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_CloseStream", result );

    return result;
}